

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O1

void ScaleSlope(int src_width,int src_height,int dst_width,int dst_height,FilterMode filtering,
               int *x,int *y,int *dx,int *dy)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int div;
  
  div = dst_width;
  if (dst_width == 1) {
    div = src_width;
  }
  if (src_width < 0x8000) {
    div = dst_width;
  }
  iVar2 = dst_height;
  if (dst_height == 1) {
    iVar2 = src_height;
  }
  if (src_height < 0x8000) {
    iVar2 = dst_height;
  }
  iVar1 = -src_width;
  if (0 < src_width) {
    iVar1 = src_width;
  }
  if (filtering == kFilterLinear) {
    if (iVar1 < div) {
      if (1 < div) {
        iVar1 = FixedDiv1_X86(iVar1,div);
        *dx = iVar1;
        iVar1 = 0;
        goto LAB_00149201;
      }
    }
    else {
      uVar3 = FixedDiv_X86(iVar1,div);
      *dx = uVar3;
      if ((int)uVar3 < 0) {
        iVar1 = 0x8000 - (-uVar3 >> 1);
      }
      else {
        iVar1 = (uVar3 >> 1) - 0x8000;
      }
LAB_00149201:
      *x = iVar1;
    }
    iVar2 = FixedDiv_X86(src_height,iVar2);
    *dy = iVar2;
    uVar3 = iVar2 >> 1;
  }
  else if (filtering == kFilterBilinear) {
    if (iVar1 < div) {
      if (1 < div) {
        iVar1 = FixedDiv1_X86(iVar1,div);
        *dx = iVar1;
        iVar1 = 0;
        goto LAB_001491a1;
      }
    }
    else {
      uVar3 = FixedDiv_X86(iVar1,div);
      *dx = uVar3;
      if ((int)uVar3 < 0) {
        iVar1 = 0x8000 - (-uVar3 >> 1);
      }
      else {
        iVar1 = (uVar3 >> 1) - 0x8000;
      }
LAB_001491a1:
      *x = iVar1;
    }
    if (src_height < iVar2) {
      if (iVar2 < 2) goto LAB_0014921e;
      iVar2 = FixedDiv1_X86(src_height,iVar2);
      *dy = iVar2;
      goto LAB_001490cf;
    }
    uVar3 = FixedDiv_X86(src_height,iVar2);
    *dy = uVar3;
    if ((int)uVar3 < 0) {
      uVar3 = 0x8000 - (-uVar3 >> 1);
    }
    else {
      uVar3 = (uVar3 >> 1) - 0x8000;
    }
  }
  else if (filtering == kFilterBox) {
    iVar1 = FixedDiv_X86(iVar1,div);
    *dx = iVar1;
    iVar2 = FixedDiv_X86(src_height,iVar2);
    *dy = iVar2;
    *x = 0;
LAB_001490cf:
    uVar3 = 0;
  }
  else {
    iVar1 = FixedDiv_X86(iVar1,div);
    *dx = iVar1;
    iVar2 = FixedDiv_X86(src_height,iVar2);
    *dy = iVar2;
    uVar3 = *dx;
    uVar4 = uVar3 >> 1;
    if ((int)uVar3 < 0) {
      uVar4 = -(-uVar3 >> 1);
    }
    *x = uVar4;
    uVar4 = *dy;
    uVar3 = uVar4 >> 1;
    if ((int)uVar4 < 0) {
      uVar3 = -(-uVar4 >> 1);
    }
  }
  *y = uVar3;
LAB_0014921e:
  if (src_width < 0) {
    *x = *x + (div + -1) * *dx;
    *dx = -*dx;
  }
  return;
}

Assistant:

void ScaleSlope(int src_width,
                int src_height,
                int dst_width,
                int dst_height,
                enum FilterMode filtering,
                int* x,
                int* y,
                int* dx,
                int* dy) {
  assert(x != NULL);
  assert(y != NULL);
  assert(dx != NULL);
  assert(dy != NULL);
  assert(src_width != 0);
  assert(src_height != 0);
  assert(dst_width > 0);
  assert(dst_height > 0);
  // Check for 1 pixel and avoid FixedDiv overflow.
  if (dst_width == 1 && src_width >= 32768) {
    dst_width = src_width;
  }
  if (dst_height == 1 && src_height >= 32768) {
    dst_height = src_height;
  }
  if (filtering == kFilterBox) {
    // Scale step for point sampling duplicates all pixels equally.
    *dx = FixedDiv(Abs(src_width), dst_width);
    *dy = FixedDiv(src_height, dst_height);
    *x = 0;
    *y = 0;
  } else if (filtering == kFilterBilinear) {
    // Scale step for bilinear sampling renders last pixel once for upsample.
    if (dst_width <= Abs(src_width)) {
      *dx = FixedDiv(Abs(src_width), dst_width);
      *x = CENTERSTART(*dx, -32768);  // Subtract 0.5 (32768) to center filter.
    } else if (dst_width > 1) {
      *dx = FixedDiv1(Abs(src_width), dst_width);
      *x = 0;
    }
    if (dst_height <= src_height) {
      *dy = FixedDiv(src_height, dst_height);
      *y = CENTERSTART(*dy, -32768);  // Subtract 0.5 (32768) to center filter.
    } else if (dst_height > 1) {
      *dy = FixedDiv1(src_height, dst_height);
      *y = 0;
    }
  } else if (filtering == kFilterLinear) {
    // Scale step for bilinear sampling renders last pixel once for upsample.
    if (dst_width <= Abs(src_width)) {
      *dx = FixedDiv(Abs(src_width), dst_width);
      *x = CENTERSTART(*dx, -32768);  // Subtract 0.5 (32768) to center filter.
    } else if (dst_width > 1) {
      *dx = FixedDiv1(Abs(src_width), dst_width);
      *x = 0;
    }
    *dy = FixedDiv(src_height, dst_height);
    *y = *dy >> 1;
  } else {
    // Scale step for point sampling duplicates all pixels equally.
    *dx = FixedDiv(Abs(src_width), dst_width);
    *dy = FixedDiv(src_height, dst_height);
    *x = CENTERSTART(*dx, 0);
    *y = CENTERSTART(*dy, 0);
  }
  // Negative src_width means horizontally mirror.
  if (src_width < 0) {
    *x += (dst_width - 1) * *dx;
    *dx = -*dx;
    // src_width = -src_width;   // Caller must do this.
  }
}